

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamePattern.cpp
# Opt level: O2

double Tld_Dga_Eval_C_A(size_t len,uint8_t *val)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  size_t i;
  size_t sVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  size_t count [5];
  long local_48 [6];
  
  local_48[4] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
    local_48[""[(ulong)val[sVar4] + 0x16]] = local_48[""[(ulong)val[sVar4] + 0x16]] + 1;
  }
  dVar7 = 0.0;
  pdVar5 = char_group_proba;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    uVar1 = *(undefined8 *)((long)local_48 + lVar6 * 2);
    dVar2 = ((double)*(int *)((long)char_group_weight + lVar6) / 26.0 +
            ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
            (double)(long)(len + 1);
    dVar3 = log(dVar2 / *pdVar5);
    dVar7 = dVar7 + dVar3 * dVar2;
    pdVar5 = pdVar5 + 1;
  }
  return dVar7;
}

Assistant:

static double Tld_Dga_Eval_C_A(size_t len, uint8_t * val)
{
    size_t count[5];
    double klt = 0;

    memset(count, 0, sizeof(count));

    for (size_t i = 0; i<len; i++)
    {
        uint8_t char_group_index = char_group[val[i] - 10];
        count[char_group_index] ++;
    }

    for (int j = 0; j < 5; j++)
    {
        double p = ((double)count[j] + (double)char_group_weight[j] / 26.0) / ((double)(len + 1));
        double kl = p * log(p / char_group_proba[j]);
        klt += kl;
    }

    return klt;
}